

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O2

int do_bind(char *host,int port,int protocol,int *family)

{
  int iVar1;
  int __fd;
  int iVar2;
  addrinfo *ai_list;
  int reuse;
  char portstr [16];
  addrinfo local_48;
  
  reuse = 1;
  ai_list = (addrinfo *)0x0;
  if ((host == (char *)0x0) || (*host == '\0')) {
    host = "0.0.0.0";
  }
  sprintf(portstr,"%d",port);
  local_48.ai_flags = 0;
  local_48.ai_family = 0;
  local_48.ai_socktype = 0;
  local_48.ai_protocol = 0;
  local_48.ai_addrlen = 0;
  local_48._20_4_ = 0;
  local_48.ai_addr = (sockaddr *)0x0;
  local_48.ai_canonname = (char *)0x0;
  local_48.ai_next = (addrinfo *)0x0;
  if (protocol == 6) {
    local_48.ai_socktype = 1;
  }
  else {
    if (protocol != 0x11) {
      __assert_fail("protocol == IPPROTO_UDP",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/socket_server.c"
                    ,0x56d,"int do_bind(const char *, int, int, int *)");
    }
    local_48.ai_socktype = 2;
  }
  local_48.ai_protocol = protocol;
  iVar1 = getaddrinfo(host,portstr,&local_48,(addrinfo **)&ai_list);
  if (iVar1 == 0) {
    iVar1 = ai_list->ai_family;
    *family = iVar1;
    __fd = socket(iVar1,ai_list->ai_socktype,0);
    iVar1 = -1;
    if ((-1 < __fd) &&
       ((iVar1 = setsockopt(__fd,1,2,&reuse,4), iVar1 == -1 ||
        (iVar2 = bind(__fd,(sockaddr *)ai_list->ai_addr,ai_list->ai_addrlen), iVar1 = __fd,
        iVar2 != 0)))) {
      close(__fd);
      iVar1 = -1;
    }
    freeaddrinfo((addrinfo *)ai_list);
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int
do_bind(const char *host, int port, int protocol, int *family) {
	int fd;
	int status;
	int reuse = 1;
	struct addrinfo ai_hints;
	struct addrinfo *ai_list = NULL;
	char portstr[16];
	if (host == NULL || host[0] == 0) {
		host = "0.0.0.0";	// INADDR_ANY
	}
	sprintf(portstr, "%d", port);
	memset( &ai_hints, 0, sizeof( ai_hints ) );
	ai_hints.ai_family = AF_UNSPEC;
	if (protocol == IPPROTO_TCP) {
		ai_hints.ai_socktype = SOCK_STREAM;
	} else {
		assert(protocol == IPPROTO_UDP);
		ai_hints.ai_socktype = SOCK_DGRAM;
	}
	ai_hints.ai_protocol = protocol;

	status = getaddrinfo( host, portstr, &ai_hints, &ai_list );
	if ( status != 0 ) {
		return -1;
	}
	*family = ai_list->ai_family;
	fd = socket(*family, ai_list->ai_socktype, 0);
	if (fd < 0) {
		goto _failed_fd;
	}
	if (setsockopt(fd, SOL_SOCKET, SO_REUSEADDR, (void *)&reuse, sizeof(int))==-1) {
		goto _failed;
	}
	status = bind(fd, (struct sockaddr *)ai_list->ai_addr, ai_list->ai_addrlen);
	if (status != 0)
		goto _failed;

	freeaddrinfo( ai_list );
	return fd;
_failed:
	close(fd);
_failed_fd:
	freeaddrinfo( ai_list );
	return -1;
}